

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

size_t __thiscall SQASTWriter::writeSingleString(SQASTWriter *this,SQChar *s)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  char *in_RSI;
  OutputStream *in_RDI;
  size_t idx;
  size_t stringLength;
  size_t startOff;
  uint32_t in_stack_ffffffffffffffcc;
  ulong local_28;
  
  lVar1 = (**(code **)(*in_RDI->_vptr_OutputStream + 0x18))();
  sVar2 = strlen(in_RSI);
  OutputStream::writeUInt32(in_RDI,in_stack_ffffffffffffffcc);
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    OutputStream::writeInt8(in_RDI,(int8_t)(in_stack_ffffffffffffffcc >> 0x18));
  }
  lVar3 = (**(code **)(*in_RDI->_vptr_OutputStream + 0x18))();
  return lVar3 - lVar1;
}

Assistant:

size_t SQASTWriter::writeSingleString(const SQChar *s) {
  size_t startOff = stream->pos();

  size_t stringLength = strlen(s);

  stream->writeUInt32(stringLength);

  for (size_t idx = 0; idx < stringLength; ++idx) {
    stream->writeInt8(s[idx]);
  }

  return stream->pos() - startOff;
}